

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wconv
                   (char_t *s,char_t end_quote)

{
  byte bVar1;
  char_t *pcVar2;
  byte bVar3;
  byte *local_50;
  gap g;
  
  g.end = (char_t *)0x0;
  g.size = 0;
LAB_001a6785:
  do {
    bVar1 = *s;
    bVar3 = (anonymous_namespace)::chartype_table[bVar1];
    if ((bVar3 & 4) == 0) {
      bVar1 = ((byte *)s)[1];
      bVar3 = (anonymous_namespace)::chartype_table[bVar1];
      if ((bVar3 & 4) == 0) {
        bVar1 = ((byte *)s)[2];
        bVar3 = (anonymous_namespace)::chartype_table[bVar1];
        if ((bVar3 & 4) == 0) {
          bVar1 = ((byte *)s)[3];
          bVar3 = (anonymous_namespace)::chartype_table[bVar1];
          if ((bVar3 & 4) == 0) {
            s = (char_t *)((byte *)s + 4);
            goto LAB_001a6785;
          }
          s = (char_t *)((byte *)s + 3);
        }
        else {
          s = (char_t *)((byte *)s + 2);
        }
      }
      else {
        s = (char_t *)((byte *)s + 1);
      }
    }
    local_50 = (byte *)s;
    if (bVar1 == end_quote) {
      pcVar2 = gap::flush(&g,s);
      *pcVar2 = '\0';
      return (char_t *)((byte *)s + 1);
    }
    if ((bVar3 & 8) == 0) {
      if (bVar1 == 0x26) {
        s = strconv_escape(s,&g);
      }
      else {
        if (bVar1 == 0) {
          return (char_t *)0x0;
        }
        s = (char_t *)((byte *)s + 1);
      }
    }
    else {
      local_50 = (byte *)s + 1;
      *s = 0x20;
      s = (char_t *)local_50;
      if ((bVar1 == 0xd) && (*local_50 == 10)) {
        gap::push(&g,(char_t **)&local_50,1);
        s = (char_t *)local_50;
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wconv(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					if (*s == '\r')
					{
						*s++ = ' ';

						if (*s == '\n') g.push(s, 1);
					}
					else *s++ = ' ';
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}